

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.c
# Opt level: O0

IMP class_replaceMethod(Class cls,SEL name,IMP imp,char *types)

{
  char *selName;
  SEL aSelector;
  Method poVar1;
  IMP old;
  Method method;
  SEL sel;
  char *types_local;
  IMP imp_local;
  SEL name_local;
  Class cls_local;
  
  if (cls == (Class)0x0) {
    cls_local = (Class)0x0;
  }
  else {
    selName = sel_getName(name);
    aSelector = sel_registerTypedName_np(selName,types);
    poVar1 = class_getInstanceMethodNonrecursive(cls,aSelector);
    if (poVar1 == (Method)0x0) {
      class_addMethod(cls,aSelector,imp,types);
      cls_local = (Class)0x0;
    }
    else {
      cls_local = (Class)poVar1->imp;
      poVar1->imp = imp;
    }
  }
  return (IMP)cls_local;
}

Assistant:

IMP class_replaceMethod(Class cls, SEL name, IMP imp, const char *types)
{
	if (Nil == cls) { return (IMP)0; }
	SEL sel = sel_registerTypedName_np(sel_getName(name), types);
	Method method = class_getInstanceMethodNonrecursive(cls, sel);
	if (method == NULL)
	{
		class_addMethod(cls, sel, imp, types);
		return NULL;
	}
	IMP old = (IMP)method->imp;
	method->imp = imp;
	return old;
}